

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O3

uint32_t day14a::get_index(string *input,int stretch)

{
  undefined8 *puVar1;
  char needle;
  char *key;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  value_type *__val;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint32_t index;
  ulong uVar12;
  int local_60;
  ulong local_48;
  
  key = (input->_M_dataplus)._M_p;
  puVar6 = (undefined8 *)operator_new(40000);
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  lVar9 = 0x28;
  do {
    *(undefined8 *)((long)puVar6 + lVar9 + 0x20) = puVar6[4];
    uVar2 = *puVar6;
    uVar3 = puVar6[1];
    uVar4 = puVar6[3];
    puVar1 = (undefined8 *)((long)puVar6 + lVar9 + 0x10);
    *puVar1 = puVar6[2];
    puVar1[1] = uVar4;
    *(undefined8 *)((long)puVar6 + lVar9) = uVar2;
    ((undefined8 *)((long)puVar6 + lVar9))[1] = uVar3;
    lVar9 = lVar9 + 0x28;
  } while (lVar9 != 40000);
  *(undefined4 *)puVar6 = 0xffffffff;
  lVar9 = 0;
  lVar11 = 4;
  local_48 = 1;
  uVar12 = 0;
  local_60 = 0;
LAB_0010d5e1:
  index = (uint32_t)uVar12;
  uVar10 = (ulong)(index + (int)((uVar12 & 0xffffffff) / 1000) * -1000);
  if (*(uint32_t *)(puVar6 + uVar10 * 5) != index) {
    hash_and_stretch(key,index,stretch,(MD5Cache *)(puVar6 + uVar10 * 5));
  }
  lVar7 = lVar11 + (uVar12 / 1000) * -40000;
  lVar8 = 0;
  do {
    needle = *(char *)((long)puVar6 + lVar8 + lVar7);
    if ((*(char *)((long)puVar6 + lVar8 + lVar7 + 2) == needle) &&
       (*(char *)((long)puVar6 + lVar8 + lVar7 + 1) == needle)) {
      if (needle != '\0') {
        lVar7 = 0;
        uVar10 = local_48;
        goto LAB_0010d69e;
      }
      break;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1e);
  goto LAB_0010d66b;
  while( true ) {
    lVar8 = (uVar10 / 1000) * -40000 + 0x28 + lVar7;
    if ((int)uVar10 != *(int *)((long)puVar6 + lVar8 + lVar9)) {
      hash_and_stretch(key,(int)uVar10,stretch,(MD5Cache *)((long)puVar6 + lVar8 + lVar9));
    }
    cVar5 = find_sequence<5>((char *)((long)puVar6 + (uVar10 / 1000) * -40000 + 0x2c + lVar7 + lVar9
                                     ),needle);
    lVar7 = lVar7 + 0x28;
    uVar10 = uVar10 + 1;
    if (cVar5 != '\0') break;
LAB_0010d69e:
    if ((int)lVar7 == 40000) goto LAB_0010d66b;
  }
  local_60 = local_60 + 1;
  if (local_60 == 0x40) {
    operator_delete(puVar6,40000);
    return index;
  }
LAB_0010d66b:
  uVar12 = uVar12 + 1;
  lVar11 = lVar11 + 0x28;
  lVar9 = lVar9 + 0x28;
  local_48 = local_48 + 1;
  goto LAB_0010d5e1;
}

Assistant:

uint32_t get_index(const std::string& input, int stretch) {
		const char* key = input.c_str();
		std::vector<MD5Cache> hash_cache(1000);
		hash_cache[0].index = -1;
		for(int i = 0, found = 0;; ++i) {
			auto& hc = hash_cache[i % 1000];
			if(hc.index != i) {
				hash_and_stretch(key, i, stretch, hc);
			}
			char c = find_sequence<3>(hc.md5, 0);
			if(c != 0) {
				for(int j = i + 1; j <= i + 1000; ++j) {
					auto& hc = hash_cache[j % 1000];
					if(hc.index != j) {
						hash_and_stretch(key, j, stretch, hc);
					}
					if(find_sequence<5>(hc.md5, c)) {
						if(++found == 64) {
							return i;
						}
						break;
					}
				}
			}
		}
		return 0;
	}